

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualExpression.cpp
# Opt level: O0

EqualExpression * __thiscall
ninx::parser::element::EqualExpression::clone_impl(EqualExpression *this)

{
  EqualExpression *this_00;
  ASTElement local_30;
  Block *local_10;
  EqualExpression *this_local;
  
  local_10 = (Block *)this;
  this_00 = (EqualExpression *)operator_new(0x28);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::operator->(&(this->super_BinaryExpression).first);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::operator->(&(this->super_BinaryExpression).second);
  ASTElement::clone<ninx::parser::element::Expression>(&local_30);
  EqualExpression(this_00,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                           *)&stack0xffffffffffffffe8,
                  (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                   *)&local_30);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&local_30);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&stack0xffffffffffffffe8);
  return this_00;
}

Assistant:

ninx::parser::element::EqualExpression *ninx::parser::element::EqualExpression::clone_impl() {
    return new EqualExpression(this->first->clone<Expression>(), this->second->clone<Expression>());
}